

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O3

void TestStringToFloatVarious(void)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  undefined8 uVar5;
  bool all_used;
  int processed;
  bool local_5;
  int local_4;
  
  dVar4 = StrToF("",0x38,0.0,&local_4,&local_5);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0f";
    pcVar3 = "StrToF(\"\", flags, 0.0f, &processed, &all_used)";
    uVar5 = 0;
    uVar2 = 0xfc3;
LAB_00851ed3:
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",uVar5,dVar4,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,pcVar1,pcVar3);
    abort();
  }
  if (local_5 == false) {
    uVar2 = 0xfc4;
LAB_00851e9a:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
           ,uVar2,"all_used");
    abort();
  }
  dVar4 = StrToF("",0x38,1.0,&local_4,&local_5);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    pcVar1 = "1.0f";
    pcVar3 = "StrToF(\"\", flags, 1.0f, &processed, &all_used)";
    uVar5 = 0x3ff0000000000000;
    uVar2 = 0xfc6;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfc7;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF("  ",0x38,0.0,&local_4,&local_5);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    pcVar1 = "0.0f";
    pcVar3 = "StrToF(\"  \", flags, 0.0f, &processed, &all_used)";
    uVar5 = 0;
    uVar2 = 0xfc9;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfca;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF("  ",0x38,1.0,&local_4,&local_5);
  if ((dVar4 != 1.0) || (NAN(dVar4))) {
    pcVar1 = "1.0f";
    pcVar3 = "StrToF(\"  \", flags, 1.0f, &processed, &all_used)";
    uVar5 = 0x3ff0000000000000;
    uVar2 = 0xfcc;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfcd;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF("42",0x38,0.0,&local_4,&local_5);
  if ((dVar4 != 42.0) || (NAN(dVar4))) {
    pcVar1 = "42.0f";
    pcVar3 = "StrToF(\"42\", flags, 0.0f, &processed, &all_used)";
    uVar5 = 0x4045000000000000;
    uVar2 = 0xfcf;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfd0;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF(" + 42 ",0x38,0.0,&local_4,&local_5);
  if ((dVar4 != 42.0) || (NAN(dVar4))) {
    pcVar1 = "42.0f";
    pcVar3 = "StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)";
    uVar5 = 0x4045000000000000;
    uVar2 = 0xfd2;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfd3;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF(" - 42 ",0x38,0.0,&local_4,&local_5);
  if ((dVar4 != -42.0) || (NAN(dVar4))) {
    pcVar1 = "-42.0f";
    pcVar3 = "StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)";
    uVar5 = 0xc045000000000000;
    uVar2 = 0xfd5;
    goto LAB_00851ed3;
  }
  if (local_5 == false) {
    uVar2 = 0xfd6;
    goto LAB_00851e9a;
  }
  dVar4 = StrToF("x",0x38,1.0,&local_4,&local_5);
  if (!NAN(dVar4)) {
    pcVar1 = "Double::NaN()";
    pcVar3 = "StrToF(\"x\", flags, 1.0f, &processed, &all_used)";
    uVar5 = 0x7ff8000000000000;
    uVar2 = 0xfd8;
    goto LAB_00851ed3;
  }
  if (local_4 == 0) {
    dVar4 = StrToF(" x",0x38,1.0,&local_4,&local_5);
    if (!NAN(dVar4)) {
      pcVar1 = "Double::NaN()";
      pcVar3 = "StrToF(\" x\", flags, 1.0f, &processed, &all_used)";
      uVar5 = 0x7ff8000000000000;
      uVar2 = 0xfdb;
      goto LAB_00851ed3;
    }
    if (local_4 == 0) {
      dVar4 = StrToF("42x",0x38,0.0,&local_4,&local_5);
      if (!NAN(dVar4)) {
        pcVar1 = "Double::NaN()";
        pcVar3 = "StrToF(\"42x\", flags, 0.0f, &processed, &all_used)";
        uVar5 = 0x7ff8000000000000;
        uVar2 = 0xfde;
        goto LAB_00851ed3;
      }
      if (local_4 == 0) {
        dVar4 = StrToF("42 x",0x38,0.0,&local_4,&local_5);
        if (!NAN(dVar4)) {
          pcVar1 = "Double::NaN()";
          pcVar3 = "StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)";
          uVar5 = 0x7ff8000000000000;
          uVar2 = 0xfe1;
          goto LAB_00851ed3;
        }
        if (local_4 == 0) {
          dVar4 = StrToF(" + 42 x",0x38,0.0,&local_4,&local_5);
          if (!NAN(dVar4)) {
            pcVar1 = "Double::NaN()";
            pcVar3 = "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)";
            uVar5 = 0x7ff8000000000000;
            uVar2 = 0xfe4;
            goto LAB_00851ed3;
          }
          if (local_4 == 0) {
            dVar4 = StrToF(" - 42 x",0x38,0.0,&local_4,&local_5);
            if (!NAN(dVar4)) {
              pcVar1 = "Double::NaN()";
              pcVar3 = "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)";
              uVar5 = 0x7ff8000000000000;
              uVar2 = 0xfe7;
              goto LAB_00851ed3;
            }
            if (local_4 == 0) {
              dVar4 = StrToF("",0x3c,0.0,&local_4,&local_5);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                pcVar1 = "0.0f";
                pcVar3 = "StrToF(\"\", flags, 0.0f, &processed, &all_used)";
                uVar5 = 0;
                uVar2 = 0xff0;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0xff1;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF("",0x3c,1.0,&local_4,&local_5);
              if ((dVar4 != 1.0) || (NAN(dVar4))) {
                pcVar1 = "1.0f";
                pcVar3 = "StrToF(\"\", flags, 1.0f, &processed, &all_used)";
                uVar5 = 0x3ff0000000000000;
                uVar2 = 0xff3;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0xff4;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF("  ",0x3c,0.0,&local_4,&local_5);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                pcVar1 = "0.0f";
                pcVar3 = "StrToF(\"  \", flags, 0.0f, &processed, &all_used)";
                uVar5 = 0;
                uVar2 = 0xff6;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0xff7;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF("  ",0x3c,1.0,&local_4,&local_5);
              if ((dVar4 != 1.0) || (NAN(dVar4))) {
                pcVar1 = "1.0f";
                pcVar3 = "StrToF(\"  \", flags, 1.0f, &processed, &all_used)";
                uVar5 = 0x3ff0000000000000;
                uVar2 = 0xff9;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0xffa;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF("42",0x3c,0.0,&local_4,&local_5);
              if ((dVar4 != 42.0) || (NAN(dVar4))) {
                pcVar1 = "42.0f";
                pcVar3 = "StrToF(\"42\", flags, 0.0f, &processed, &all_used)";
                uVar5 = 0x4045000000000000;
                uVar2 = 0xffc;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0xffd;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF(" + 42 ",0x3c,0.0,&local_4,&local_5);
              if ((dVar4 != 42.0) || (NAN(dVar4))) {
                pcVar1 = "42.0f";
                pcVar3 = "StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)";
                uVar5 = 0x4045000000000000;
                uVar2 = 0xfff;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0x1000;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF(" - 42 ",0x3c,0.0,&local_4,&local_5);
              if ((dVar4 != -42.0) || (NAN(dVar4))) {
                pcVar1 = "-42.0f";
                pcVar3 = "StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)";
                uVar5 = 0xc045000000000000;
                uVar2 = 0x1002;
                goto LAB_00851ed3;
              }
              if (local_5 == false) {
                uVar2 = 0x1003;
                goto LAB_00851e9a;
              }
              dVar4 = StrToF("x",0x3c,1.0,&local_4,&local_5);
              if (!NAN(dVar4)) {
                pcVar1 = "Double::NaN()";
                pcVar3 = "StrToF(\"x\", flags, 1.0f, &processed, &all_used)";
                uVar5 = 0x7ff8000000000000;
                uVar2 = 0x1005;
                goto LAB_00851ed3;
              }
              if (local_4 == 0) {
                dVar4 = StrToF(" x",0x3c,1.0,&local_4,&local_5);
                if (!NAN(dVar4)) {
                  pcVar1 = "Double::NaN()";
                  pcVar3 = "StrToF(\" x\", flags, 1.0f, &processed, &all_used)";
                  uVar5 = 0x7ff8000000000000;
                  uVar2 = 0x1008;
                  goto LAB_00851ed3;
                }
                if (local_4 == 0) {
                  dVar4 = StrToF("42x",0x3c,0.0,&local_4,&local_5);
                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                    pcVar1 = "42.0f";
                    pcVar3 = "StrToF(\"42x\", flags, 0.0f, &processed, &all_used)";
                    uVar5 = 0x4045000000000000;
                    uVar2 = 0x100b;
                    goto LAB_00851ed3;
                  }
                  if (local_4 != 2) {
                    uVar2 = 0x100c;
                    goto LAB_008515bc;
                  }
                  dVar4 = StrToF("42 x",0x3c,0.0,&local_4,&local_5);
                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                    pcVar1 = "42.0f";
                    pcVar3 = "StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)";
                    uVar5 = 0x4045000000000000;
                    uVar2 = 0x100e;
                    goto LAB_00851ed3;
                  }
                  if (local_4 != 3) {
                    pcVar1 = "3";
                    uVar2 = 0x100f;
                    uVar5 = 3;
                    goto LAB_00851f06;
                  }
                  dVar4 = StrToF(" + 42 x",0x3c,0.0,&local_4,&local_5);
                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                    pcVar1 = "42.0f";
                    pcVar3 = "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)";
                    uVar5 = 0x4045000000000000;
                    uVar2 = 0x1011;
                    goto LAB_00851ed3;
                  }
                  if (local_4 == 6) {
                    dVar4 = StrToF(" - 42 x",0x3c,0.0,&local_4,&local_5);
                    if ((dVar4 != -42.0) || (NAN(dVar4))) {
                      pcVar1 = "-42.0f";
                      pcVar3 = "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)";
                      uVar5 = 0xc045000000000000;
                      uVar2 = 0x1014;
                      goto LAB_00851ed3;
                    }
                    if (local_4 == 6) {
                      dVar4 = StrToF("",0x2c,0.0,&local_4,&local_5);
                      if ((dVar4 != 0.0) || (NAN(dVar4))) {
                        pcVar1 = "0.0f";
                        pcVar3 = "StrToF(\"\", flags, 0.0f, &processed, &all_used)";
                        uVar5 = 0;
                        uVar2 = 0x101c;
                        goto LAB_00851ed3;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x101d;
                        goto LAB_00851e9a;
                      }
                      dVar4 = StrToF("",0x2c,1.0,&local_4,&local_5);
                      if ((dVar4 != 1.0) || (NAN(dVar4))) {
                        pcVar1 = "1.0f";
                        pcVar3 = "StrToF(\"\", flags, 1.0f, &processed, &all_used)";
                        uVar5 = 0x3ff0000000000000;
                        uVar2 = 0x101f;
                        goto LAB_00851ed3;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x1020;
                        goto LAB_00851e9a;
                      }
                      dVar4 = StrToF("  ",0x2c,0.0,&local_4,&local_5);
                      if ((dVar4 != 0.0) || (NAN(dVar4))) {
                        pcVar1 = "0.0f";
                        pcVar3 = "StrToF(\"  \", flags, 0.0f, &processed, &all_used)";
                        uVar5 = 0;
                        uVar2 = 0x1022;
                        goto LAB_00851ed3;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x1023;
                        goto LAB_00851e9a;
                      }
                      dVar4 = StrToF("  ",0x2c,1.0,&local_4,&local_5);
                      if ((dVar4 != 1.0) || (NAN(dVar4))) {
                        pcVar1 = "1.0f";
                        pcVar3 = "StrToF(\"  \", flags, 1.0f, &processed, &all_used)";
                        uVar5 = 0x3ff0000000000000;
                        uVar2 = 0x1025;
                        goto LAB_00851ed3;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x1026;
                        goto LAB_00851e9a;
                      }
                      dVar4 = StrToF("42",0x2c,0.0,&local_4,&local_5);
                      if ((dVar4 != 42.0) || (NAN(dVar4))) {
                        pcVar1 = "42.0f";
                        pcVar3 = "StrToF(\"42\", flags, 0.0f, &processed, &all_used)";
                        uVar5 = 0x4045000000000000;
                        uVar2 = 0x1028;
                        goto LAB_00851ed3;
                      }
                      if (local_5 == false) {
                        uVar2 = 0x1029;
                        goto LAB_00851e9a;
                      }
                      dVar4 = StrToF(" + 42 ",0x2c,0.0,&local_4,&local_5);
                      if ((dVar4 != 42.0) || (NAN(dVar4))) {
                        pcVar1 = "42.0f";
                        pcVar3 = "StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)";
                        uVar5 = 0x4045000000000000;
                        uVar2 = 0x102b;
                        goto LAB_00851ed3;
                      }
                      if (local_4 == 5) {
                        dVar4 = StrToF(" - 42 ",0x2c,0.0,&local_4,&local_5);
                        if ((dVar4 != -42.0) || (NAN(dVar4))) {
                          pcVar1 = "-42.0f";
                          pcVar3 = "StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)";
                          uVar5 = 0xc045000000000000;
                          uVar2 = 0x102e;
                          goto LAB_00851ed3;
                        }
                        if (local_4 == 5) {
                          dVar4 = StrToF("x",0x2c,1.0,&local_4,&local_5);
                          if (!NAN(dVar4)) {
                            pcVar1 = "Double::NaN()";
                            pcVar3 = "StrToF(\"x\", flags, 1.0f, &processed, &all_used)";
                            uVar5 = 0x7ff8000000000000;
                            uVar2 = 0x1031;
                            goto LAB_00851ed3;
                          }
                          if (local_4 == 0) {
                            dVar4 = StrToF(" x",0x2c,1.0,&local_4,&local_5);
                            if (!NAN(dVar4)) {
                              pcVar1 = "Double::NaN()";
                              pcVar3 = "StrToF(\" x\", flags, 1.0f, &processed, &all_used)";
                              uVar5 = 0x7ff8000000000000;
                              uVar2 = 0x1034;
                              goto LAB_00851ed3;
                            }
                            if (local_4 == 0) {
                              dVar4 = StrToF("42x",0x2c,0.0,&local_4,&local_5);
                              if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                pcVar1 = "42.0f";
                                pcVar3 = "StrToF(\"42x\", flags, 0.0f, &processed, &all_used)";
                                uVar5 = 0x4045000000000000;
                                uVar2 = 0x1037;
                                goto LAB_00851ed3;
                              }
                              if (local_4 == 2) {
                                dVar4 = StrToF("42 x",0x2c,0.0,&local_4,&local_5);
                                if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                  pcVar1 = "42.0f";
                                  pcVar3 = "StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)";
                                  uVar5 = 0x4045000000000000;
                                  uVar2 = 0x103a;
                                  goto LAB_00851ed3;
                                }
                                if (local_4 == 2) {
                                  dVar4 = StrToF(" + 42 x",0x2c,0.0,&local_4,&local_5);
                                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                    pcVar1 = "42.0f";
                                    pcVar3 = 
                                    "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)";
                                    uVar5 = 0x4045000000000000;
                                    uVar2 = 0x103d;
                                    goto LAB_00851ed3;
                                  }
                                  if (local_4 == 5) {
                                    dVar4 = StrToF(" - 42 x",0x2c,0.0,&local_4,&local_5);
                                    if ((dVar4 != -42.0) || (NAN(dVar4))) {
                                      pcVar1 = "-42.0f";
                                      pcVar3 = 
                                      "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)";
                                      uVar5 = 0xc045000000000000;
                                      uVar2 = 0x1040;
                                      goto LAB_00851ed3;
                                    }
                                    if (local_4 == 5) {
                                      dVar4 = StrToF(" +42 ",0xc,0.0,&local_4,&local_5);
                                      if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                        pcVar1 = "42.0f";
                                        pcVar3 = 
                                        "StrToF(\" +42 \", flags, 0.0f, &processed, &all_used)";
                                        uVar5 = 0x4045000000000000;
                                        uVar2 = 0x1046;
                                        goto LAB_00851ed3;
                                      }
                                      if (local_4 == 4) {
                                        dVar4 = StrToF(" -42 ",0xc,0.0,&local_4,&local_5);
                                        if ((dVar4 != -42.0) || (NAN(dVar4))) {
                                          pcVar1 = "-42.0f";
                                          pcVar3 = 
                                          "StrToF(\" -42 \", flags, 0.0f, &processed, &all_used)";
                                          uVar5 = 0xc045000000000000;
                                          uVar2 = 0x1049;
                                          goto LAB_00851ed3;
                                        }
                                        if (local_4 == 4) {
                                          dVar4 = StrToF(" + 42 ",0xc,0.0,&local_4,&local_5);
                                          if (!NAN(dVar4)) {
                                            pcVar1 = "Double::NaN()";
                                            pcVar3 = 
                                            "StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)"
                                            ;
                                            uVar5 = 0x7ff8000000000000;
                                            uVar2 = 0x104c;
                                            goto LAB_00851ed3;
                                          }
                                          if (local_4 == 0) {
                                            dVar4 = StrToF(" - 42 ",0xc,0.0,&local_4,&local_5);
                                            if (!NAN(dVar4)) {
                                              pcVar1 = "Double::NaN()";
                                              pcVar3 = 
                                              "StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                                              ;
                                              uVar5 = 0x7ff8000000000000;
                                              uVar2 = 0x104f;
                                              goto LAB_00851ed3;
                                            }
                                            if (local_4 == 0) {
                                              dVar4 = StrToF("",0,0.0,&local_4,&local_5);
                                              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                pcVar1 = "0.0f";
                                                pcVar3 = 
                                                "StrToF(\"\", flags, 0.0f, &processed, &all_used)";
                                                uVar5 = 0;
                                                uVar2 = 0x1055;
                                                goto LAB_00851ed3;
                                              }
                                              if (local_5 == false) {
                                                uVar2 = 0x1056;
                                                goto LAB_00851e9a;
                                              }
                                              dVar4 = StrToF("",0,1.0,&local_4,&local_5);
                                              if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                pcVar1 = "1.0f";
                                                pcVar3 = 
                                                "StrToF(\"\", flags, 1.0f, &processed, &all_used)";
                                                uVar5 = 0x3ff0000000000000;
                                                uVar2 = 0x1058;
                                                goto LAB_00851ed3;
                                              }
                                              if (local_5 == false) {
                                                uVar2 = 0x1059;
                                                goto LAB_00851e9a;
                                              }
                                              dVar4 = StrToF("  ",0,0.0,&local_4,&local_5);
                                              if (!NAN(dVar4)) {
                                                pcVar1 = "Double::NaN()";
                                                pcVar3 = 
                                                "StrToF(\"  \", flags, 0.0f, &processed, &all_used)"
                                                ;
                                                uVar5 = 0x7ff8000000000000;
                                                uVar2 = 0x105b;
                                                goto LAB_00851ed3;
                                              }
                                              if (local_4 == 0) {
                                                dVar4 = StrToF("  ",0,1.0,&local_4,&local_5);
                                                if (!NAN(dVar4)) {
                                                  pcVar1 = "Double::NaN()";
                                                  pcVar3 = 
                                                  "StrToF(\"  \", flags, 1.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x105e;
                                                  goto LAB_00851ed3;
                                                }
                                                if (local_4 == 0) {
                                                  dVar4 = StrToF("42",0,0.0,&local_4,&local_5);
                                                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                                    pcVar1 = "42.0f";
                                                    pcVar3 = 
                                                  "StrToF(\"42\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4045000000000000;
                                                  uVar2 = 0x1061;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1062;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF(" + 42 ",0,0.0,&local_4,&local_5);
                                                  if (!NAN(dVar4)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1064;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" - 42 ",0,0.0,&local_4,&local_5)
                                                    ;
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1067;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF("x",0,1.0,&local_4,&local_5);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\"x\", flags, 1.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x106a;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" x",0,1.0,&local_4,&local_5);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\" x\", flags, 1.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x106d;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF("42x",0,0.0,&local_4,&local_5);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\"42x\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1070;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF("42 x",0,0.0,&local_4,&local_5);
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1073;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" + 42 x",0,0.0,&local_4,&local_5
                                                                  );
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1076;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" - 42 x",0,0.0,&local_4,&local_5
                                                                  );
                                                    if (!NAN(dVar4)) {
                                                      pcVar1 = "Double::NaN()";
                                                      pcVar3 = 
                                                  "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1079;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" ",8,0.0,&local_4,&local_5);
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0f";
                                                      pcVar3 = 
                                                  "StrToF(\" \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0;
                                                  uVar2 = 0x107f;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1080;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF(" ",8,1.0,&local_4,&local_5);
                                                  if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                    pcVar1 = "1.0f";
                                                    pcVar3 = 
                                                  "StrToF(\" \", flags, 1.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0x1082;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1083;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF(" 42",8,0.0,&local_4,&local_5);
                                                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                                    pcVar1 = "42.0f";
                                                    pcVar3 = 
                                                  "StrToF(\" 42\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4045000000000000;
                                                  uVar2 = 0x1085;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1086;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF("42 ",8,0.0,&local_4,&local_5);
                                                  if (!NAN(dVar4)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToF(\"42 \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1088;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    dVar4 = StrToF(" ",0x10,0.0,&local_4,&local_5);
                                                    if ((dVar4 != 0.0) || (NAN(dVar4))) {
                                                      pcVar1 = "0.0f";
                                                      pcVar3 = 
                                                  "StrToF(\" \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0;
                                                  uVar2 = 0x108e;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x108f;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF(" ",0x10,1.0,&local_4,&local_5);
                                                  if ((dVar4 != 1.0) || (NAN(dVar4))) {
                                                    pcVar1 = "1.0f";
                                                    pcVar3 = 
                                                  "StrToF(\" \", flags, 1.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x3ff0000000000000;
                                                  uVar2 = 0x1091;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1092;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF("42 ",0x10,0.0,&local_4,&local_5);
                                                  if ((dVar4 != 42.0) || (NAN(dVar4))) {
                                                    pcVar1 = "42.0f";
                                                    pcVar3 = 
                                                  "StrToF(\"42 \", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x4045000000000000;
                                                  uVar2 = 0x1094;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_5 == false) {
                                                    uVar2 = 0x1095;
                                                    goto LAB_00851e9a;
                                                  }
                                                  dVar4 = StrToF(" 42",0x10,0.0,&local_4,&local_5);
                                                  if (!NAN(dVar4)) {
                                                    pcVar1 = "Double::NaN()";
                                                    pcVar3 = 
                                                  "StrToF(\" 42\", flags, 0.0f, &processed, &all_used)"
                                                  ;
                                                  uVar5 = 0x7ff8000000000000;
                                                  uVar2 = 0x1097;
                                                  goto LAB_00851ed3;
                                                  }
                                                  if (local_4 == 0) {
                                                    return;
                                                  }
                                                  uVar2 = 0x1098;
                                                  }
                                                  else {
                                                    uVar2 = 0x1089;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x107a;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x1077;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x1074;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x1071;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x106e;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x106b;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x1068;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 0x1065;
                                                  }
                                                }
                                                else {
                                                  uVar2 = 0x105f;
                                                }
                                              }
                                              else {
                                                uVar2 = 0x105c;
                                              }
                                            }
                                            else {
                                              uVar2 = 0x1050;
                                            }
                                          }
                                          else {
                                            uVar2 = 0x104d;
                                          }
                                          goto LAB_00851f03;
                                        }
                                        uVar2 = 0x104a;
                                      }
                                      else {
                                        uVar2 = 0x1047;
                                      }
                                      pcVar1 = "4";
                                      uVar5 = 4;
                                      goto LAB_00851f06;
                                    }
                                    uVar2 = 0x1041;
                                  }
                                  else {
                                    uVar2 = 0x103e;
                                  }
                                  goto LAB_00851675;
                                }
                                uVar2 = 0x103b;
                              }
                              else {
                                uVar2 = 0x1038;
                              }
LAB_008515bc:
                              pcVar1 = "2";
                              uVar5 = 2;
                              goto LAB_00851f06;
                            }
                            uVar2 = 0x1035;
                          }
                          else {
                            uVar2 = 0x1032;
                          }
                          goto LAB_00851f03;
                        }
                        uVar2 = 0x102f;
                      }
                      else {
                        uVar2 = 0x102c;
                      }
LAB_00851675:
                      pcVar1 = "5";
                      uVar5 = 5;
                      goto LAB_00851f06;
                    }
                    uVar2 = 0x1015;
                  }
                  else {
                    uVar2 = 0x1012;
                  }
                  pcVar1 = "6";
                  uVar5 = 6;
                  goto LAB_00851f06;
                }
                uVar2 = 0x1009;
              }
              else {
                uVar2 = 0x1006;
              }
            }
            else {
              uVar2 = 0xfe8;
            }
          }
          else {
            uVar2 = 0xfe5;
          }
        }
        else {
          uVar2 = 0xfe2;
        }
      }
      else {
        uVar2 = 0xfdf;
      }
    }
    else {
      uVar2 = 0xfdc;
    }
  }
  else {
    uVar2 = 0xfd9;
  }
LAB_00851f03:
  pcVar1 = "0";
  uVar5 = 0;
LAB_00851f06:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-conversions.cc"
         ,uVar2,pcVar1,"processed",uVar5,local_4);
  abort();
}

Assistant:

TEST(StringToFloatVarious) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(42.0f, StrToF(" +42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(-42.0f, StrToF(" -42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);
}